

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_resolveFlattenCircularImportsComponents_Test::
~ModelFlattening_resolveFlattenCircularImportsComponents_Test
          (ModelFlattening_resolveFlattenCircularImportsComponents_Test *this)

{
  ModelFlattening_resolveFlattenCircularImportsComponents_Test *this_local;
  
  ~ModelFlattening_resolveFlattenCircularImportsComponents_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ModelFlattening, resolveFlattenCircularImportsComponents)
{
    const std::string resolveError =
        std::string("Cyclic dependencies were found when attempting to resolve a component in the model 'importExample2b'. The dependency loop is:\n")
        + " - component 'sideB' specifies an import from ':this:' to '" + resourcePath("modelflattening/") + "circularImport1.cellml';\n"
        + " - component 'shared' specifies an import from '" + resourcePath("modelflattening/") + "circularImport1.cellml' to '" + resourcePath("modelflattening/") + "circularImport2.cellml'; and\n"
        + " - component 'circular2' specifies an import from '" + resourcePath("modelflattening/") + "circularImport2.cellml' to '" + resourcePath("modelflattening/") + "circularImport1.cellml'.";

    const std::string flattenError =
        std::string("Cyclic dependencies were found when attempting to flatten a component in the model 'importExample2b'. The dependency loop is:\n")
        + " - component 'sideB' specifies an import from ':this:' to '" + resourcePath("modelflattening/") + "circularImport1.cellml';\n"
        + " - component 'shared' specifies an import from '" + resourcePath("modelflattening/") + "circularImport1.cellml' to '" + resourcePath("modelflattening/") + "circularImport2.cellml'; and\n"
        + " - component 'circular2' specifies an import from '" + resourcePath("modelflattening/") + "circularImport2.cellml' to '" + resourcePath("modelflattening/") + "circularImport1.cellml'.";

    auto parser = libcellml::Parser::create();
    auto originalModel = parser->parseModel(fileContents("modelflattening/importExample2b.cellml"));
    auto importer = libcellml::Importer::create();

    // Resolve the imports.
    importer->resolveImports(originalModel, resourcePath("modelflattening/"));

    // Check for issues: expect one reporting the circular import.
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(resolveError, importer->issue(0)->description());

    // Create a flattened version to demonstrate the diagnostics.
    auto flatModel = importer->flattenModel(originalModel);
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(flattenError, importer->issue(0)->description());
    EXPECT_EQ(nullptr, flatModel);
}